

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kxsort.h
# Opt level: O1

void kx::
     radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,2>
               (uint *s,uint *e)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  int i;
  ulong uVar9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  last_ [257];
  size_t count [256];
  uint *local_1028 [2];
  long local_1018 [256];
  ulong local_818 [257];
  
  memset(local_1028,0,0x808);
  memset(local_818,0,0x800);
  puVar3 = s;
  if (s < e) {
    do {
      local_818[*(byte *)((long)puVar3 + 2)] = local_818[*(byte *)((long)puVar3 + 2)] + 1;
      puVar3 = puVar3 + 1;
    } while (puVar3 < e);
  }
  local_1028[1] = s;
  local_1028[0] = s;
  lVar4 = 0;
  do {
    s = s + local_818[lVar4];
    local_1018[lVar4] = (long)s;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xff);
  uVar5 = 0;
  do {
    puVar3 = local_1028[uVar5] + local_818[uVar5];
    if (puVar3 == e) {
      local_1018[uVar5 - 1] = (long)e;
    }
    else {
      puVar7 = (uint *)local_1018[uVar5 - 1];
      while (puVar7 != puVar3) {
        uVar9 = (ulong)(*puVar7 >> 0x10 & 0xff);
        uVar6 = *puVar7;
        if (uVar5 != uVar9) {
          do {
            puVar7 = (uint *)local_1018[uVar9 - 1];
            local_1018[uVar9 - 1] = (long)(puVar7 + 1);
            uVar1 = *puVar7;
            *puVar7 = uVar6;
            uVar9 = (ulong)(uVar1 >> 0x10 & 0xff);
            uVar6 = uVar1;
          } while (uVar5 != uVar9);
          *(uint *)local_1018[uVar5 - 1] = uVar1;
        }
        puVar7 = (uint *)(local_1018[uVar5 - 1] + 4);
        local_1018[uVar5 - 1] = (long)puVar7;
      }
    }
  } while ((puVar3 != e) && (uVar5 = uVar5 + 1, uVar5 != 0x100));
  lVar4 = 0;
  do {
    if (local_818[lVar4] < 0x41) {
      if (1 < local_818[lVar4]) {
        puVar3 = local_1028[lVar4];
        puVar7 = (uint *)local_1018[lVar4 + -1];
        puVar2 = puVar3;
        while (puVar8 = puVar2, puVar2 = puVar8 + 1, puVar2 < puVar7) {
          uVar6 = puVar8[1];
          if (uVar6 < *puVar8) {
            puVar8[1] = *puVar8;
            for (; (puVar3 < puVar8 && (uVar6 < puVar8[-1])); puVar8 = puVar8 + -1) {
              *puVar8 = puVar8[-1];
            }
            *puVar8 = uVar6;
          }
        }
      }
    }
    else {
      radix_sort_core_<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,kx::RadixTraitsUnsigned<unsigned_int>,1>
                (local_1028[lVar4],local_1018[lVar4 + -1]);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  return;
}

Assistant:

inline void radix_sort_core_(RandomIt s, RandomIt e, RadixTraits radix_traits)
    {
        RandomIt last_[kRadixBin + 1];
        RandomIt *last = last_ + 1;
        size_t count[kRadixBin] = {0};

        for (RandomIt i = s; i < e; ++i) {
            ++count[radix_traits.kth_byte(*i, kWhichByte)];
        }

        last_[0] = last_[1] = s;

        for (int i = 1; i < kRadixBin; ++i) {
            last[i] = last[i-1] + count[i-1];
        }

        for (int i = 0; i < kRadixBin; ++i) {
            RandomIt end = last[i-1] + count[i];
            if (end == e) { last[i] = e; break; }
            while (last[i] != end) {
                ValueType swapper = *last[i];
                int tag = radix_traits.kth_byte(swapper, kWhichByte);
                if (tag != i) {
                    do {
                        std::swap(swapper, *last[tag]++);
                    } while ((tag = radix_traits.kth_byte(swapper, kWhichByte)) != i);
                    *last[i] = swapper;
                }
                ++last[i];
            }
        }

        if (kWhichByte > 0) {
            for (int i = 0; i < kRadixBin; ++i) {
                if (count[i] > kInsertSortThreshold) {
                    radix_sort_core_<RandomIt, ValueType, RadixTraits,
                            (kWhichByte > 0 ? (kWhichByte - 1) : 0)>
                            (last[i-1], last[i], radix_traits);
                } else if (count[i] > 1) {
                    insert_sort_core_<RandomIt, ValueType, RadixTraits>(last[i-1], last[i], radix_traits);
                }
            }
        }
    }